

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O2

void __thiscall
Fl_Graphics_Driver::yxline(Fl_Graphics_Driver *this,int x,int y,int y1,int x2,int y3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  short sVar4;
  XPoint p [4];
  
  iVar2 = 1;
  if (1 < fl_line_width_) {
    iVar2 = fl_line_width_;
  }
  iVar3 = 0x7fff - iVar2;
  iVar2 = -iVar2;
  iVar1 = x;
  if (iVar3 < x) {
    iVar1 = iVar3;
  }
  sVar4 = (short)iVar2;
  p[0].x = (short)iVar1;
  if (x < iVar2) {
    p[0].x = sVar4;
  }
  iVar1 = y;
  if (iVar3 < y) {
    iVar1 = iVar3;
  }
  p[0].y = (short)iVar1;
  if (y < iVar2) {
    p[0].y = sVar4;
  }
  p[1].y = (short)y1;
  if (iVar3 < y1) {
    p[1].y = (short)iVar3;
  }
  if (y1 < iVar2) {
    p[1].y = sVar4;
  }
  p[2].x = (short)x2;
  if (iVar3 < x2) {
    p[2].x = (short)iVar3;
  }
  if (x2 < iVar2) {
    p[2].x = sVar4;
  }
  if (y3 <= iVar3) {
    iVar3 = y3;
  }
  p[3].y = (short)iVar3;
  if (y3 < iVar2) {
    p[3].y = sVar4;
  }
  p[1].x = p[0].x;
  p[2].y = p[1].y;
  p[3].x = p[2].x;
  XDrawLines(fl_display,fl_window,fl_gc,p,4,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::yxline(int x, int y, int y1, int x2, int y3) {
#if defined(USE_X11)
  XPoint p[4];
  p[0].x = p[1].x = clip_x(x);  p[0].y = clip_x(y);
  p[1].y = p[2].y = clip_x(y1); p[2].x = p[3].x = clip_x(x2);
  p[3].y = clip_x(y3);
  XDrawLines(fl_display, fl_window, fl_gc, p, 4, 0);
#elif defined(WIN32)
  if(y3<y1) y3--;
  else y3++;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x, y1);
  LineTo(fl_gc, x2, y1);
  LineTo(fl_gc, x2, y3);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x, y1);
  CGContextAddLineToPoint(fl_gc, x2, y1);
  CGContextAddLineToPoint(fl_gc, x2, y3);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y-0.5, fl_quartz_line_width_, 1));
    CGContextFillRect(fl_gc, CGRectMake(x2  -  fl_quartz_line_width_/2, y3-0.5, fl_quartz_line_width_, 1));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}